

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O3

unique_ptr<interfaces::WalletLoader,_std::default_delete<interfaces::WalletLoader>_> __thiscall
interfaces::MakeWalletLoader(interfaces *this,Chain *chain,ArgsManager *args)

{
  long lVar1;
  undefined8 *puVar2;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  puVar2 = (undefined8 *)operator_new(0xc0);
  *puVar2 = &PTR__WalletLoaderImpl_013b9c10;
  ::wallet::WalletContext::WalletContext((WalletContext *)(puVar2 + 1));
  puVar2[0x13] = 0;
  puVar2[0x14] = 0;
  puVar2[0x11] = 0;
  puVar2[0x12] = 0;
  puVar2[0xf] = 0;
  puVar2[0x10] = 0;
  puVar2[0x16] = puVar2 + 0x15;
  puVar2[0x15] = puVar2 + 0x15;
  puVar2[0x17] = 0;
  puVar2[1] = chain;
  puVar2[3] = args;
  *(undefined8 **)this = puVar2;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (__uniq_ptr_data<interfaces::WalletLoader,_std::default_delete<interfaces::WalletLoader>,_true,_true>
            )(__uniq_ptr_data<interfaces::WalletLoader,_std::default_delete<interfaces::WalletLoader>,_true,_true>
              )this;
  }
  __stack_chk_fail();
}

Assistant:

std::unique_ptr<WalletLoader> MakeWalletLoader(Chain& chain, ArgsManager& args)
{
    return std::make_unique<wallet::WalletLoaderImpl>(chain, args);
}